

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.hpp
# Opt level: O1

shared_ptr<helics::Core> __thiscall
helics::CoreFactory::
CoreTypeBuilder<helics::NetworkCore<helics::tcp::TcpComms,_(gmlc::networking::InterfaceTypes)0>_>::
build(CoreTypeBuilder<helics::NetworkCore<helics::tcp::TcpComms,_(gmlc::networking::InterfaceTypes)0>_>
      *this,string_view name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<helics::Core> sVar1;
  undefined1 local_39;
  CoreBuilder local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  local_28._M_len = (size_t)name._M_str;
  local_38._vptr_CoreBuilder = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<helics::NetworkCore<helics::tcp::TcpComms,(gmlc::networking::InterfaceTypes)0>,std::allocator<helics::NetworkCore<helics::tcp::TcpComms,(gmlc::networking::InterfaceTypes)0>>,std::basic_string_view<char,std::char_traits<char>>&>
            (&_Stack_30,
             (NetworkCore<helics::tcp::TcpComms,_(gmlc::networking::InterfaceTypes)0> **)&local_38,
             (allocator<helics::NetworkCore<helics::tcp::TcpComms,_(gmlc::networking::InterfaceTypes)0>_>
              *)&local_39,&local_28);
  this[1].super_CoreBuilder._vptr_CoreBuilder = (_func_int **)0x0;
  (this->super_CoreBuilder)._vptr_CoreBuilder = local_38._vptr_CoreBuilder;
  this[1].super_CoreBuilder._vptr_CoreBuilder = (_func_int **)_Stack_30._M_pi;
  sVar1.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<helics::Core>)
         sVar1.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<Core> build(std::string_view name) override
        {
            return std::make_shared<CoreTYPE>(name);
        }